

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

int dumbfile_mem_seek(void *f,long n)

{
  bool bVar1;
  dumbfile_mem_status *s;
  long n_local;
  void *f_local;
  
  *(int *)((long)f + 8) = (int)n;
  bVar1 = *(uint *)((long)f + 0xc) < *(uint *)((long)f + 8);
  if (bVar1) {
    *(undefined4 *)((long)f + 8) = *(undefined4 *)((long)f + 0xc);
  }
  f_local._4_4_ = (uint)bVar1;
  return f_local._4_4_;
}

Assistant:

static int DUMBCALLBACK dumbfile_mem_seek(void *f, long n)
{
	dumbfile_mem_status * s = (dumbfile_mem_status *) f;
	s->offset = n;
	if (s->offset > s->size)
	{
		s->offset = s->size;
		return 1;
	}
	return 0;
}